

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

size_t check_for_missing<PredictionData<double,long>>
                 (PredictionData<double,_long> *prediction_data,Imputer *imputer,size_t *ix_arr,
                 int nthreads)

{
  double *pdVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  long lVar8;
  size_t sVar9;
  int *piVar10;
  size_t sVar11;
  vector<char,_std::allocator<char>_> has_missing;
  allocator_type local_3a;
  value_type_conflict5 local_39;
  vector<char,_std::allocator<char>_> local_38;
  
  local_39 = '\0';
  std::vector<char,_std::allocator<char>_>::vector
            (&local_38,prediction_data->nrows,&local_39,&local_3a);
  uVar6 = prediction_data->nrows;
  if (uVar6 != 0) {
    lVar3 = 0;
    lVar4 = 0;
    uVar5 = 0;
LAB_00211dcd:
    pdVar1 = prediction_data->numeric_data;
    if (pdVar1 == (double *)0x0) {
      if (prediction_data->Xr != (double *)0x0) {
        lVar8 = prediction_data->Xr_indptr[uVar5];
        lVar2 = prediction_data->Xr_indptr[uVar5 + 1];
        if (lVar8 < lVar2) {
          do {
            if (0x7fefffffffffffff < (ulong)ABS(prediction_data->Xr[lVar8])) goto LAB_00211e59;
            lVar8 = lVar8 + 1;
          } while (lVar2 != lVar8);
        }
      }
    }
    else {
      sVar9 = imputer->ncols_numeric;
      if (prediction_data->is_col_major == false) {
        if (sVar9 != 0) {
          sVar11 = 0;
          do {
            if (0x7fefffffffffffff <
                (*(ulong *)((long)pdVar1 + sVar11 * 8 + sVar9 * lVar4) & 0x7fffffffffffffff))
            goto LAB_00211e59;
            sVar11 = sVar11 + 1;
          } while (sVar9 != sVar11);
        }
      }
      else if (sVar9 != 0) {
        puVar7 = (ulong *)((long)pdVar1 + lVar4);
        do {
          if (0x7fefffffffffffff < (*puVar7 & 0x7fffffffffffffff)) goto LAB_00211e59;
          puVar7 = puVar7 + uVar6;
          sVar9 = sVar9 - 1;
        } while (sVar9 != 0);
      }
    }
    goto LAB_00211e63;
  }
LAB_00211f1f:
  sVar9 = 0;
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)0x0) {
    return 0;
  }
LAB_00211f27:
  operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
  return sVar9;
LAB_00211e59:
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [uVar5] = '\x01';
LAB_00211e63:
  if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar5] == '\0') {
    sVar9 = imputer->ncols_categ;
    if (prediction_data->is_col_major == false) {
      if (sVar9 != 0) {
        sVar11 = 0;
        do {
          if (*(int *)((long)prediction_data->categ_data + sVar11 * 4 + sVar9 * lVar3) < 0)
          goto LAB_00211edd;
          sVar11 = sVar11 + 1;
        } while (sVar9 != sVar11);
      }
    }
    else if (sVar9 != 0) {
      piVar10 = (int *)((long)prediction_data->categ_data + lVar3);
      do {
        if (*piVar10 < 0) goto LAB_00211edd;
        piVar10 = piVar10 + prediction_data->nrows;
        sVar9 = sVar9 - 1;
      } while (sVar9 != 0);
    }
  }
LAB_00211e6f:
  uVar5 = uVar5 + 1;
  uVar6 = prediction_data->nrows;
  lVar4 = lVar4 + 8;
  lVar3 = lVar3 + 4;
  if (uVar6 <= uVar5) goto LAB_00211ee4;
  goto LAB_00211dcd;
LAB_00211edd:
  local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
  [uVar5] = '\x01';
  goto LAB_00211e6f;
LAB_00211ee4:
  if (uVar6 != 0) {
    uVar5 = 0;
    sVar9 = 0;
    do {
      if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar5] != '\0') {
        sVar11 = ix_arr[sVar9];
        ix_arr[sVar9] = ix_arr[uVar5];
        ix_arr[uVar5] = sVar11;
        sVar9 = sVar9 + 1;
        uVar6 = prediction_data->nrows;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar6);
    goto LAB_00211f27;
  }
  goto LAB_00211f1f;
}

Assistant:

size_t check_for_missing(PredictionData  &prediction_data,
                         Imputer         &imputer,
                         size_t          ix_arr[],
                         int             nthreads)
{
    std::vector<char> has_missing(prediction_data.nrows, false);

    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(has_missing, prediction_data, imputer)
    for (size_t_for row = 0; row < (decltype(row))prediction_data.nrows; row++)
    {
        if (prediction_data.numeric_data != NULL)
        {
            if (prediction_data.is_col_major)
            {
                for (size_t col = 0; col < imputer.ncols_numeric; col++)
                {
                    if (is_na_or_inf(prediction_data.numeric_data[row + col * prediction_data.nrows]))
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }

            else
            {
                for (size_t col = 0; col < imputer.ncols_numeric; col++)
                {
                    if (is_na_or_inf(prediction_data.numeric_data[col + row * imputer.ncols_numeric]))
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }
        }

        else if (prediction_data.Xr != NULL)
        {
            for (auto ix = prediction_data.Xr_indptr[row]; ix < prediction_data.Xr_indptr[row + 1]; ix++)
            {
                if (is_na_or_inf(prediction_data.Xr[ix]))
                {
                    has_missing[row] = true;
                    break;
                }
            }
        }

        if (!has_missing[row])
        {
            if (prediction_data.is_col_major)
            {
                for (size_t col = 0; col < imputer.ncols_categ; col++)
                {
                    if (prediction_data.categ_data[row + col * prediction_data.nrows] < 0)
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }

            else
            {
                for (size_t col = 0; col < imputer.ncols_categ; col++)
                {
                    if (prediction_data.categ_data[col + row * imputer.ncols_categ] < 0)
                    {
                        has_missing[row] = true;
                        break;
                    }
                }
            }
        }
    }

    size_t st = 0;
    size_t temp;
    for (size_t row = 0; row < prediction_data.nrows; row++)
    {
        if (has_missing[row])
        {
            temp        = ix_arr[st];
            ix_arr[st]  = ix_arr[row];
            ix_arr[row] = temp;
            st++;
        }
    }

    if (st == 0)
        return 0;

    return st;
}